

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLParser.cpp
# Opt level: O0

bool __thiscall llvm::yaml::Scanner::scanFlowEntry(Scanner *this)

{
  undefined1 local_60 [8];
  Token T;
  Scanner *this_local;
  
  T.Value.field_2._8_8_ = this;
  removeSimpleKeyCandidatesOnFlowLevel(this,this->FlowLevel);
  this->IsSimpleKeyAllowed = true;
  Token::Token((Token *)local_60);
  local_60._0_4_ = TK_FlowEntry;
  T._0_8_ = this->Current;
  T.Range.Data = (char *)0x1;
  skip(this,1);
  AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>
  ::push_back(&this->TokenQueue,(Token *)local_60);
  Token::~Token((Token *)local_60);
  return true;
}

Assistant:

bool Scanner::scanFlowEntry() {
  removeSimpleKeyCandidatesOnFlowLevel(FlowLevel);
  IsSimpleKeyAllowed = true;
  Token T;
  T.Kind = Token::TK_FlowEntry;
  T.Range = StringRef(Current, 1);
  skip(1);
  TokenQueue.push_back(T);
  return true;
}